

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_grammar.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::AssemblyGrammar::lookupSpecConstantOpcode(AssemblyGrammar *this,Op opcode)

{
  spv_ext_inst_table_t *psVar1;
  SpecConstantOpcodeEntry *found;
  SpecConstantOpcodeEntry *last;
  Op opcode_local;
  AssemblyGrammar *this_local;
  
  psVar1 = (spv_ext_inst_table_t *)
           std::
           find_if<spvtools::(anonymous_namespace)::SpecConstantOpcodeEntry_const*,spvtools::AssemblyGrammar::lookupSpecConstantOpcode(spv::Op)const::__0>
                     ((SpecConstantOpcodeEntry *)(anonymous_namespace)::kOpSpecConstantOpcodes,
                      (SpecConstantOpcodeEntry *)&kTable_1_0,
                      (anon_class_4_1_64e6d48c_for__M_pred)opcode);
  if (psVar1 == &kTable_1_0) {
    this_local._4_4_ = SPV_ERROR_INVALID_LOOKUP;
  }
  else {
    this_local._4_4_ = SPV_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t AssemblyGrammar::lookupSpecConstantOpcode(spv::Op opcode) const {
  const auto* last = kOpSpecConstantOpcodes + kNumOpSpecConstantOpcodes;
  const auto* found =
      std::find_if(kOpSpecConstantOpcodes, last,
                   [opcode](const SpecConstantOpcodeEntry& entry) {
                     return opcode == entry.opcode;
                   });
  if (found == last) return SPV_ERROR_INVALID_LOOKUP;
  return SPV_SUCCESS;
}